

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::overlap_iterator::
setToBegin(overlap_iterator *this)

{
  IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U> *pIVar1;
  unsigned_long *puVar2;
  uint offset;
  ulong uVar3;
  ulong uVar4;
  
  pIVar1 = (this->super_iterator).super_const_iterator.map;
  offset = pIVar1->rootSize;
  uVar3 = (ulong)offset;
  if (pIVar1->height == 0) {
    if (uVar3 == 0) {
      offset = 0;
    }
    else {
      puVar2 = &(pIVar1->field_0).rootLeaf.
                super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Compilation::NetAlias_*,_8U>
                .first[0].right;
      uVar4 = 0;
      do {
        if ((this->searchKey).right < ((interval<unsigned_long> *)(puVar2 + -1))->left) break;
        if ((this->searchKey).left <= *puVar2) {
          offset = (uint)uVar4;
          break;
        }
        uVar4 = uVar4 + 1;
        puVar2 = puVar2 + 2;
      } while (uVar3 != uVar4);
    }
    const_iterator::setRoot((const_iterator *)this,offset);
    return;
  }
  if (uVar3 == 0) {
    offset = 0;
  }
  else {
    puVar2 = (unsigned_long *)
             ((long)((pIVar1->field_0).rootLeaf.
                     super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Compilation::NetAlias_*,_8U>
                     .first + 4) + 8);
    uVar4 = 0;
    do {
      if ((this->searchKey).right < ((interval<unsigned_long> *)(puVar2 + -1))->left) break;
      if ((this->searchKey).left <= *puVar2) {
        offset = (uint)uVar4;
        break;
      }
      uVar4 = uVar4 + 1;
      puVar2 = puVar2 + 2;
    } while (uVar3 != uVar4);
  }
  const_iterator::setRoot((const_iterator *)this,offset);
  treeFind(this);
  return;
}

Assistant:

void setToBegin() {
        if (this->isFlat()) {
            this->setRoot(this->map->rootLeaf.findFirstOverlap(0, this->map->rootSize, searchKey));
        }
        else {
            this->setRoot(
                this->map->rootBranch.findFirstOverlap(0, this->map->rootSize, searchKey));
            treeFind();
        }
    }